

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void nullcPrintPointerMarkerInfo(markerType marker)

{
  uint uVar1;
  ExternTypeInfo *pEVar2;
  uint type;
  ExternTypeInfo *codeTypes;
  char *pcStack_18;
  uint codeTypeCount;
  char *codeSymbols;
  markerType marker_local;
  
  codeSymbols = (char *)marker;
  pcStack_18 = nullcDebugSymbols((uint *)0x0);
  codeTypes._4_4_ = 0;
  pEVar2 = nullcDebugTypeInfo((uint *)((long)&codeTypes + 4));
  if (((ulong)codeSymbols & 1) == 0) {
    printf("unmarked");
  }
  else {
    printf("visible");
  }
  if (((ulong)codeSymbols & 2) == 0) {
    if (((ulong)codeSymbols & 4) != 0) {
      printf(" finalizable");
    }
    if (((ulong)codeSymbols & 8) != 0) {
      printf(" finalized");
    }
    if (((ulong)codeSymbols & 0x10) != 0) {
      printf(" array");
    }
    uVar1 = (uint)((ulong)codeSymbols >> 8);
    printf(" type \'%s\' #%u",pcStack_18 + pEVar2[uVar1].offsetToName,(ulong)uVar1);
  }
  else {
    printf(" freed");
  }
  return;
}

Assistant:

void nullcPrintPointerMarkerInfo(markerType marker)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	unsigned codeTypeCount = 0;
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(&codeTypeCount);

	if(marker & OBJECT_VISIBLE)
		printf("visible");
	else
		printf("unmarked");

	if(marker & OBJECT_FREED)
	{
		printf(" freed");
		return;
	}

	if(marker & OBJECT_FINALIZABLE)
		printf(" finalizable");
	if(marker & OBJECT_FINALIZED)
		printf(" finalized");
	if(marker & OBJECT_ARRAY)
		printf(" array");

	unsigned type = unsigned(marker >> 8);

	printf(" type '%s' #%u", codeSymbols + codeTypes[type].offsetToName, type);
}